

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form8_Threshold(ThresholdDoubleForm4 Threshold)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  
  Unit_Test::intensityArray(&intensity,2);
  image.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  image.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  image.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar4 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      value = *puVar4;
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                ((ImageTemplate<unsigned_char> *)&roiY,0,0,'\x01','\x01');
      Test_Helper::uniformImage((Image *)&roiX,value,0,0,(ImageTemplate<unsigned_char> *)&roiY);
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
      ::emplace_back<PenguinV_Image::ImageTemplate<unsigned_char>>
                ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
                  *)&image,(Image *)&roiX);
      roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((Image *)&roiX);
      roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&roiY);
      puVar4 = puVar4 + 1;
    } while (puVar4 != intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi(&image,&roiX,&roiY,&roiWidth,&roiHeight);
  uVar2 = rand();
  uVar2 = uVar2 / 0xff + (uVar2 / 0xff) * -0x100 + uVar2;
  uVar3 = rand();
  uVar3 = uVar3 / 0xff + (uVar3 / 0xff) * -0x100 + uVar3;
  if (uVar3 <= uVar2) {
    uVar3 = uVar2;
  }
  (*Threshold)(image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               *roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
               *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
               image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,
               roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],
               roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],roiWidth,roiHeight,(byte)uVar2,(byte)uVar3);
  bVar1 = Unit_Test::verifyImage
                    (image.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,
                     roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[1],
                     roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[1],roiWidth,roiHeight,
                     -(*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start <= (byte)uVar3 &&
                      (byte)uVar2 <=
                      *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start));
  if (roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&image);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form8_Threshold(ThresholdDoubleForm4 Threshold)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image;

        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { image.push_back( uniformImage( value ) ); } );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        const uint8_t minThreshold = randomValue <uint8_t>( 255 );
        const uint8_t maxThreshold = randomValue <uint8_t>( minThreshold, 255 );

        Threshold( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight, minThreshold, maxThreshold );

        return verifyImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight,
                          intensity[0] < minThreshold || intensity[0] > maxThreshold ? 0 : 255 );
    }